

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

string * Color::colorize(string *__return_storage_ptr__,string *input,string *spec)

{
  Color local_24;
  string *psStack_20;
  Color c;
  string *spec_local;
  string *input_local;
  
  psStack_20 = spec;
  Color(&local_24,spec);
  colorize(__return_storage_ptr__,&local_24,input);
  ~Color(&local_24);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input, const std::string& spec)
{
#ifdef FEATURE_COLOR
  Color c (spec);
  return c.colorize (input);
#else
  return input;
#endif
}